

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void __thiscall Assimp::IFC::TempMesh::RemoveAdjacentDuplicates(TempMesh *this)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  __first;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  __last;
  ulong uVar4;
  bool bVar5;
  uint *puVar6;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  __first_00;
  IfcVector3 vmax;
  IfcVector3 vmin;
  FuzzyVectorCompare fz;
  
  __first_00._M_current =
       (this->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = false;
  do {
    if (puVar6 == puVar2) {
      if (bVar5) {
        LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4f615d);
      }
      return;
    }
    uVar1 = *puVar6;
    uVar4 = (ulong)uVar1;
    if (1 < uVar1) {
      vmin.x = 0.0;
      vmin.y = 0.0;
      vmin.z = 0.0;
      vmax.x = 0.0;
      vmax.y = 0.0;
      vmax.z = 0.0;
      ArrayBounds<aiVector3t<double>>(__first_00._M_current,uVar1,&vmin,&vmax);
      fz.epsilon = ((vmax.z - vmin.z) * (vmax.z - vmin.z) +
                   (vmax.x - vmin.x) * (vmax.x - vmin.x) + (vmax.y - vmin.y) * (vmax.y - vmin.y)) /
                   1000000000.0;
      __last._M_current = __first_00._M_current + *puVar6;
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                          (__first_00,__last,
                           (_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>)fz.epsilon);
      if (__first._M_current != __last._M_current) {
        *puVar6 = *puVar6 + (int)(((long)__last._M_current - (long)__first._M_current) / -0x18);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                  (&this->mVerts,(const_iterator)__first._M_current,
                   (const_iterator)__last._M_current);
        bVar5 = true;
      }
      uVar4 = (ulong)*puVar6;
      if (1 < uVar4) {
        bVar3 = FuzzyVectorCompare::operator()
                          (&fz,__first_00._M_current,__first_00._M_current + (uVar4 - 1));
        if (bVar3) {
          uVar1 = *puVar6;
          *puVar6 = uVar1 - 1;
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                    (&this->mVerts,__first_00._M_current + (uVar1 - 1));
          bVar5 = true;
        }
        uVar4 = (ulong)*puVar6;
      }
      if ((int)uVar4 == 0) {
        __assert_fail("cnt>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCUtil.cpp"
                      ,0x1b3,"void Assimp::IFC::TempMesh::RemoveAdjacentDuplicates()");
      }
    }
    __first_00._M_current = __first_00._M_current + uVar4;
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void TempMesh::RemoveAdjacentDuplicates() {
    bool drop = false;
    std::vector<IfcVector3>::iterator base = mVerts.begin();
    for(unsigned int& cnt : mVertcnt) {
        if (cnt < 2){
            base += cnt;
            continue;
        }

        IfcVector3 vmin,vmax;
        ArrayBounds(&*base, cnt ,vmin,vmax);


        const IfcFloat epsilon = (vmax-vmin).SquareLength() / static_cast<IfcFloat>(1e9);
        //const IfcFloat dotepsilon = 1e-9;

        //// look for vertices that lie directly on the line between their predecessor and their
        //// successor and replace them with either of them.

        //for(size_t i = 0; i < cnt; ++i) {
        //  IfcVector3& v1 = *(base+i), &v0 = *(base+(i?i-1:cnt-1)), &v2 = *(base+(i+1)%cnt);
        //  const IfcVector3& d0 = (v1-v0), &d1 = (v2-v1);
        //  const IfcFloat l0 = d0.SquareLength(), l1 = d1.SquareLength();
        //  if (!l0 || !l1) {
        //      continue;
        //  }

        //  const IfcFloat d = (d0/std::sqrt(l0))*(d1/std::sqrt(l1));

        //  if ( d >= 1.f-dotepsilon ) {
        //      v1 = v0;
        //  }
        //  else if ( d < -1.f+dotepsilon ) {
        //      v2 = v1;
        //      continue;
        //  }
        //}

        // drop any identical, adjacent vertices. this pass will collect the dropouts
        // of the previous pass as a side-effect.
        FuzzyVectorCompare fz(epsilon);
        std::vector<IfcVector3>::iterator end = base+cnt, e = std::unique( base, end, fz );
        if (e != end) {
            cnt -= static_cast<unsigned int>(std::distance(e, end));
            mVerts.erase(e,end);
            drop  = true;
        }

        // check front and back vertices for this polygon
        if (cnt > 1 && fz(*base,*(base+cnt-1))) {
            mVerts.erase(base+ --cnt);
            drop  = true;
        }

        // removing adjacent duplicates shouldn't erase everything :-)
        ai_assert(cnt>0);
        base += cnt;
    }
    if(drop) {
        IFCImporter::LogDebug("removing duplicate vertices");
    }
}